

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowlev1.c
# Opt level: O3

LispPTR N_OP_putbaseptrn(LispPTR base,LispPTR tos,int n)

{
  uint uVar1;
  
  uVar1 = n + (base & 0xfffffff);
  if ((uVar1 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar1);
  }
  *(LispPTR *)(Lisp_world + uVar1) = tos & 0xfffffff;
  return base & 0xfffffff;
}

Assistant:

LispPTR N_OP_putbaseptrn(LispPTR base, LispPTR tos, int n) {
  base = POINTERMASK & base;
  *NativeAligned4FromLAddr(base + n) = tos & POINTERMASK;
  return (base);
}